

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O2

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  ulong len;
  size_t sVar1;
  uint uVar2;
  int iVar3;
  mbedtls_ct_condition_t mVar4;
  mbedtls_ct_condition_t mVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  mbedtls_ct_uint_t x;
  mbedtls_ct_uint_t mVar10;
  uchar buf [1024];
  
  sVar1 = ctx->len;
  iVar3 = -0x4080;
  if (0xfffffffffffffc0e < sVar1 - 0x401 && ctx->padding == 0) {
    iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,buf);
    if (iVar3 == 0) {
      uVar9 = buf[0] ^ mbedtls_ct_zero;
      mVar4 = mbedtls_ct_uint_ne((ulong)buf[1],2);
      x = 0;
      mVar10 = mbedtls_ct_zero;
      for (sVar7 = 2; sVar1 != sVar7; sVar7 = sVar7 + 1) {
        mVar5 = mbedtls_ct_uint_eq((ulong)buf[sVar7],0);
        mVar10 = mVar10 | mVar5;
        x = x + (~(uint)mVar10 & 1);
      }
      len = sVar1 - 0xb;
      sVar7 = output_max_len;
      if (len < output_max_len) {
        sVar7 = len;
      }
      mVar5 = mbedtls_ct_uint_lt(x,8);
      uVar9 = mVar5 | mVar4 | ~mVar10 | (long)(-(uVar9 >> 1) | -uVar9) >> 0x3f;
      uVar2 = (uint)uVar9;
      uVar6 = uVar2 & (uint)sVar7 | ~((uint)mbedtls_ct_zero ^ uVar2) & ((int)sVar1 - (int)x) - 3U;
      mVar4 = mbedtls_ct_uint_lt(sVar7,(ulong)uVar6);
      mVar10 = mbedtls_ct_zero;
      mbedtls_ct_zeroize_if(mVar4 | uVar9,buf + 0xb,len);
      uVar8 = (uint)mVar4;
      uVar9 = (ulong)(~((uint)mbedtls_ct_zero ^ uVar8) & uVar6 | (uint)sVar7 & uVar8);
      mbedtls_ct_memmove_left(buf + (sVar1 - sVar7),sVar7,sVar7 - uVar9);
      if (output_max_len != 0) {
        switchD_00916250::default(output,buf + (sVar1 - sVar7),sVar7);
      }
      iVar3 = -(uVar2 & 0x4100 | ~((uint)mVar10 ^ uVar2) & uVar8 & 0x4400);
      *olen = uVar9;
    }
    mbedtls_platform_zeroize(buf,0x400);
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt(mbedtls_rsa_context *ctx,
                                        int (*f_rng)(void *, unsigned char *, size_t),
                                        void *p_rng,
                                        size_t *olen,
                                        const unsigned char *input,
                                        unsigned char *output,
                                        size_t output_max_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t ilen;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    ilen = ctx->len;

    if (ctx->padding != MBEDTLS_RSA_PKCS_V15) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (ilen < 16 || ilen > sizeof(buf)) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    ret = mbedtls_rsa_private(ctx, f_rng, p_rng, input, buf);

    if (ret != 0) {
        goto cleanup;
    }

    ret = mbedtls_ct_rsaes_pkcs1_v15_unpadding(buf, ilen,
                                               output, output_max_len, olen);

cleanup:
    mbedtls_platform_zeroize(buf, sizeof(buf));

    return ret;
}